

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 __thiscall djb::beckmann::u2_to_h2_std_radial(beckmann *this,vec2 *u,float_t zi,float_t z_i)

{
  float fVar1;
  float_t x;
  float_t y;
  vec3 vVar2;
  vec2 local_40;
  float_t local_38;
  float_t local_34;
  float_t u2;
  float_t u1;
  float_t z_i_local;
  float_t zi_local;
  vec2 *u_local;
  beckmann *this_local;
  
  u2 = z_i;
  u1 = zi;
  _z_i_local = u;
  u_local = (vec2 *)this;
  fVar1 = sat<float>(&u->x);
  local_34 = fVar1 * 0.99998 + 1e-05;
  fVar1 = sat<float>(&_z_i_local->y);
  local_38 = fVar1 * 0.99998 + 1e-05;
  x = qf2(this,local_34,u1,u2);
  y = qf3(this,local_38);
  vec2::vec2(&local_40,x,y);
  vVar2 = r2_to_h2(&local_40);
  return vVar2;
}

Assistant:

vec3 beckmann::u2_to_h2_std_radial(const vec2 &u, float_t zi, float_t z_i) const
{
	// remap u2 to avoid singularities
	float_t u1 = sat(u.x) * (float_t)0.99998 + (float_t)0.00001;
	float_t u2 = sat(u.y) * (float_t)0.99998 + (float_t)0.00001;
	return r2_to_h2(vec2(qf2(u1, zi, z_i), qf3(u2)));
}